

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O0

int mbedtls_ssl_cache_get(void *data,mbedtls_ssl_session *session)

{
  mbedtls_ssl_cache_entry *pmVar1;
  int iVar2;
  time_t tVar3;
  mbedtls_x509_crt *pmVar4;
  mbedtls_ssl_cache_entry *entry;
  mbedtls_ssl_cache_entry *cur;
  mbedtls_ssl_cache_context *cache;
  mbedtls_time_t t;
  int ret;
  mbedtls_ssl_session *session_local;
  void *data_local;
  
  tVar3 = time((time_t *)0x0);
  pmVar1 = *data;
  do {
    entry = pmVar1;
    if (entry == (mbedtls_ssl_cache_entry *)0x0) {
      return 1;
    }
    pmVar1 = entry->next;
  } while ((((*(int *)((long)data + 8) != 0) &&
            (*(int *)((long)data + 8) < (int)tVar3 - (int)entry->timestamp)) ||
           (session->ciphersuite != (entry->session).ciphersuite)) ||
          (((session->compression != (entry->session).compression ||
            (session->id_len != (entry->session).id_len)) ||
           (iVar2 = memcmp(session->id,(entry->session).id,(entry->session).id_len), iVar2 != 0))));
  memcpy(session->master,(entry->session).master,0x30);
  session->verify_result = (entry->session).verify_result;
  if ((entry->peer_cert).p != (uchar *)0x0) {
    pmVar4 = (mbedtls_x509_crt *)calloc(1,0x228);
    session->peer_cert = pmVar4;
    if (pmVar4 == (mbedtls_x509_crt *)0x0) {
      return 1;
    }
    mbedtls_x509_crt_init(session->peer_cert);
    iVar2 = mbedtls_x509_crt_parse(session->peer_cert,(entry->peer_cert).p,(entry->peer_cert).len);
    if (iVar2 != 0) {
      free(session->peer_cert);
      session->peer_cert = (mbedtls_x509_crt *)0x0;
      return 1;
    }
  }
  return 0;
}

Assistant:

int mbedtls_ssl_cache_get( void *data, mbedtls_ssl_session *session )
{
    int ret = 1;
#if defined(MBEDTLS_HAVE_TIME)
    mbedtls_time_t t = mbedtls_time( NULL );
#endif
    mbedtls_ssl_cache_context *cache = (mbedtls_ssl_cache_context *) data;
    mbedtls_ssl_cache_entry *cur, *entry;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_lock( &cache->mutex ) != 0 )
        return( 1 );
#endif

    cur = cache->chain;
    entry = NULL;

    while( cur != NULL )
    {
        entry = cur;
        cur = cur->next;

#if defined(MBEDTLS_HAVE_TIME)
        if( cache->timeout != 0 &&
            (int) ( t - entry->timestamp ) > cache->timeout )
            continue;
#endif

        if( session->ciphersuite != entry->session.ciphersuite ||
            session->compression != entry->session.compression ||
            session->id_len != entry->session.id_len )
            continue;

        if( memcmp( session->id, entry->session.id,
                    entry->session.id_len ) != 0 )
            continue;

        memcpy( session->master, entry->session.master, 48 );

        session->verify_result = entry->session.verify_result;

#if defined(MBEDTLS_X509_CRT_PARSE_C)
        /*
         * Restore peer certificate (without rest of the original chain)
         */
        if( entry->peer_cert.p != NULL )
        {
            if( ( session->peer_cert = mbedtls_calloc( 1,
                                 sizeof(mbedtls_x509_crt) ) ) == NULL )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_x509_crt_init( session->peer_cert );
            if( mbedtls_x509_crt_parse( session->peer_cert, entry->peer_cert.p,
                                entry->peer_cert.len ) != 0 )
            {
                mbedtls_free( session->peer_cert );
                session->peer_cert = NULL;
                ret = 1;
                goto exit;
            }
        }
#endif /* MBEDTLS_X509_CRT_PARSE_C */

        ret = 0;
        goto exit;
    }

exit:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &cache->mutex ) != 0 )
        ret = 1;
#endif

    return( ret );
}